

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceFrexpLdexp_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,ShaderFunction function,DataType xDataType,DataType expDataType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  ostream *poVar3;
  allocator<char> local_24e;
  allocator<char> local_24d;
  ShaderType local_24c;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream source;
  
  local_24c = shaderType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar3 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  getShaderInitialization_abi_cxx11_
            (&local_1c8,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"x",&local_24d);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_1e8,function,&local_208);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"exp",&local_24e);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_228,xDataType,&local_248);
  std::operator<<(poVar3,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1c8);
  pcVar2 = "    ldexp(x, exp);\n";
  if (local_24c == 8) {
    pcVar2 = "    frexp(x, exp);\n";
  }
  std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceFrexpLdexp (NegativeTestContext& ctx, glu::ShaderType shaderType, ShaderFunction function, glu::DataType xDataType, glu::DataType expDataType)
{
	DE_ASSERT(function == SHADER_FUNCTION_FREXP || function == SHADER_FUNCTION_LDEXP);

	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< "void main(void)\n"
			<< "{\n"
			<< "    " << declareAndInitializeShaderVariable(xDataType, "x")
			<< "    " << declareAndInitializeShaderVariable(expDataType, "exp");

	switch (function)
	{
		case SHADER_FUNCTION_FREXP:
			source << "    frexp(x, exp);\n";
			break;

		case SHADER_FUNCTION_LDEXP:
			source << "    ldexp(x, exp);\n";
			break;

		default:
			DE_FATAL("Unsupported shader function.");
	}

	source << "}\n";

	return source.str();
}